

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

int Dar2_LibBuildBest(Gia_Man_t *p,Vec_Int_t *vLeavesBest2,int OutBest)

{
  Dar_Lib_t *pDVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int Counter;
  
  Counter = 4;
  if (vLeavesBest2->nSize == 4) {
    iVar2 = 4;
    lVar3 = 0;
    for (lVar4 = 0; pDVar1 = s_DarLib, lVar4 < iVar2; lVar4 = lVar4 + 1) {
      iVar2 = Vec_IntEntry(vLeavesBest2,(int)lVar4);
      *(int *)(s_DarLib->pDatas->nLats + lVar3 + -0x15) = iVar2;
      iVar2 = vLeavesBest2->nSize;
      lVar3 = lVar3 + 0x18;
    }
    Dar2_LibBuildClear_rec(s_DarLib->pObjs + OutBest,&Counter);
    iVar2 = Dar2_LibBuildBest_rec(p,pDVar1->pObjs + OutBest);
    return iVar2;
  }
  __assert_fail("Vec_IntSize(vLeavesBest2) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darLib.c"
                ,0x51f,"int Dar2_LibBuildBest(Gia_Man_t *, Vec_Int_t *, int)");
}

Assistant:

int Dar2_LibBuildBest( Gia_Man_t * p, Vec_Int_t * vLeavesBest2, int OutBest )
{
    int i, iLeaf, Counter = 4;
    assert( Vec_IntSize(vLeavesBest2) == 4 );
    Vec_IntForEachEntry( vLeavesBest2, iLeaf, i )
        s_DarLib->pDatas[i].iGunc = iLeaf;
    Dar2_LibBuildClear_rec( Dar_LibObj(s_DarLib, OutBest), &Counter );
    return Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, OutBest) );
}